

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O2

void __thiscall
JsonString_TrailingBackslashUnterminated_Test::~JsonString_TrailingBackslashUnterminated_Test
          (JsonString_TrailingBackslashUnterminated_Test *this)

{
  anon_unknown.dwarf_1a1265::JsonString::~JsonString(&this->super_JsonString);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonString, TrailingBackslashUnterminated) {
    auto p = json::make_parser (proxy_);
    p.input (R"("a\)").eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::expected_close_quote));
    EXPECT_EQ (p.coordinate (), (json::coord{4U, 1U}));
}